

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

xmlParserInputPtr xmlDefaultExternalEntityLoader(char *url,char *ID,xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlParserInputPtr pxVar3;
  
  if (url != (char *)0x0) {
    pxVar2 = xmlResolveResourceFromCatalog(url,ID,ctxt);
    if (pxVar2 != (xmlChar *)0x0) {
      url = (char *)pxVar2;
    }
    if (((ctxt == (xmlParserCtxtPtr)0x0) || ((ctxt->options & 0x800) == 0)) ||
       (iVar1 = xmlStrncasecmp((xmlChar *)url,(xmlChar *)"http://",7), iVar1 != 0)) {
      pxVar3 = xmlNewInputFromFile(ctxt,url);
    }
    else {
      xmlCtxtErrIO(ctxt,0x607,url);
      pxVar3 = (xmlParserInputPtr)0x0;
    }
    if (pxVar2 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar2);
    }
    return pxVar3;
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

static xmlParserInputPtr
xmlDefaultExternalEntityLoader(const char *url, const char *ID,
                               xmlParserCtxtPtr ctxt)
{
    xmlParserInputPtr input = NULL;
    char *resource = NULL;

    (void) ID;

    if (url == NULL)
        return(NULL);

#ifdef LIBXML_CATALOG_ENABLED
    resource = (char *) xmlResolveResourceFromCatalog(url, ID, ctxt);
    if (resource != NULL)
	url = resource;
#endif

    if ((ctxt != NULL) &&
        (ctxt->options & XML_PARSE_NONET) &&
        (xmlStrncasecmp(BAD_CAST url, BAD_CAST "http://", 7) == 0)) {
        xmlCtxtErrIO(ctxt, XML_IO_NETWORK_ATTEMPT, url);
    } else {
        input = xmlNewInputFromFile(ctxt, url);
    }

    if (resource != NULL)
	xmlFree(resource);
    return(input);
}